

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

parser_error parse_themed_d(parser *p)

{
  void *pvVar1;
  char *pcVar2;
  size_t sVar3;
  char *desc;
  vault *v;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar2 = parser_getstr(p,"text");
    sVar3 = strlen(pcVar2);
    if (sVar3 == z_info->dungeon_wid) {
      pcVar2 = string_append(*(char **)((long)pvVar1 + 0x10),pcVar2);
      *(char **)((long)pvVar1 + 0x10) = pcVar2;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    else {
      p_local._4_4_ = PARSE_ERROR_VAULT_DESC_WRONG_LENGTH;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_themed_d(struct parser *p) {
	struct vault *v = parser_priv(p);
	const char *desc;

	if (!v)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	desc = parser_getstr(p, "text");
	if (strlen(desc) != z_info->dungeon_wid)
		return PARSE_ERROR_VAULT_DESC_WRONG_LENGTH;
	else
		v->text = string_append(v->text, desc);
	return PARSE_ERROR_NONE;
}